

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O2

void __thiscall adios2::core::ADIOS::ProcessUserConfig(ADIOS *this)

{
  bool bVar1;
  string homePath;
  string cfgFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  getenv("HOME");
  std::__cxx11::string::assign((char *)&local_48);
  SetUserOptionDefaults(this);
  std::operator+(&local_28,&local_48,"/.config/adios2/adios2.yaml");
  bVar1 = adios2sys::SystemTools::FileExists(&local_28);
  if (bVar1) {
    helper::ParseUserOptionsFile(&this->m_Comm,&local_28,&this->m_UserOptions,&local_48);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void ADIOS::ProcessUserConfig()
{
    // read config parameters from config file
    std::string homePath;
#ifdef _WIN32
    homePath = getenv("HOMEPATH");
#else
    homePath = getenv("HOME");
#endif
    SetUserOptionDefaults();
    const std::string cfgFile = homePath + "/.config/adios2/adios2.yaml";
    if (adios2sys::SystemTools::FileExists(cfgFile))
    {
        helper::ParseUserOptionsFile(m_Comm, cfgFile, m_UserOptions, homePath);
    }
}